

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O2

void __thiscall MathOp::Tanh_ex::back(Tanh_ex *this)

{
  int *piVar1;
  bool bVar2;
  Mat *pMVar3;
  Mat *pMVar4;
  Mat local_b0;
  Mat local_88;
  Mat local_60;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  piVar1 = &(this->super_Op).backRound;
  *piVar1 = *piVar1 + 1;
  bVar2 = NeuronMat::getIsBack(this->a);
  if (!bVar2) {
    pMVar3 = NeuronMat::getForward(this->res);
    pMVar4 = NeuronMat::getForward(this->res);
    Mat::oneMinus_IE(&local_60,pMVar4);
    Mat::dot(&local_b0,pMVar3,&local_60);
    local_30 = 0;
    local_38 = 0x100000;
    Mat::operator/(&local_88,&local_b0,(ll128 *)&local_38);
    pMVar3 = NeuronMat::getGrad(this->a);
    Mat::operator=(pMVar3,&local_88);
    Mat::~Mat(&local_88);
    Mat::~Mat(&local_b0);
    Mat::~Mat(&local_60);
    pMVar3 = NeuronMat::getGrad(this->a);
    pMVar4 = NeuronMat::getGrad(this->res);
    Mat::dot(&local_60,pMVar3,pMVar4);
    local_30 = 0;
    local_38 = 2;
    Mat::operator*(&local_b0,&local_60,(ll128 *)&local_38);
    local_20 = 0;
    local_28 = 0x100000;
    Mat::operator/(&local_88,&local_b0,(ll128 *)&local_28);
    pMVar3 = NeuronMat::getGrad(this->a);
    Mat::operator=(pMVar3,&local_88);
    Mat::~Mat(&local_88);
    Mat::~Mat(&local_b0);
    Mat::~Mat(&local_60);
  }
  return;
}

Assistant:

void MathOp::Tanh_ex::back(){
    backRound++;
    if (!a->getIsBack()){
        *a->getGrad()=res->getForward()->dot(res->getForward()->oneMinus_IE())/IE;
        *a->getGrad()=a->getGrad()->dot(*res->getGrad())*2/IE;
    }
/*cout<<"result.grad:"<<endl;
    res->getGrad()->print();
    cout<<"a.grad:"<<endl;
    a->getGrad()->print();*/

}